

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

int AF__PlayerInfo_SetLogText
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  FString this;
  FString *other;
  char *text;
  FString local_40;
  FString log;
  player_t *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x202,
                  "int AF__PlayerInfo_SetLogText(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x03') {
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x202,
                  "int AF__PlayerInfo_SetLogText(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  log.Chars = *(char **)&param->field_0;
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x203,
                  "int AF__PlayerInfo_SetLogText(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type == '\x02') {
    other = VMValue::s(param + 1);
    FString::FString(&local_40,other);
    this = log;
    text = FString::operator_cast_to_char_(&local_40);
    player_t::SetLogText((player_t *)this.Chars,text);
    FString::~FString(&local_40);
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_STRING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x203,
                "int AF__PlayerInfo_SetLogText(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(_PlayerInfo, SetLogText)
{
	PARAM_SELF_STRUCT_PROLOGUE(player_t);
	PARAM_STRING(log);
	self->SetLogText(log);
	return 0;
}